

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

vector<crnlib::color_quad<unsigned_char,_int>_> * __thiscall
crnlib::vector<crnlib::color_quad<unsigned_char,_int>_>::append
          (vector<crnlib::color_quad<unsigned_char,_int>_> *this,
          vector<crnlib::color_quad<unsigned_char,_int>_> *other)

{
  uint uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *__src;
  uint min_new_capacity;
  
  uVar1 = other->m_size;
  if ((ulong)uVar1 != 0) {
    uVar2 = this->m_size;
    __src = other->m_p;
    min_new_capacity = uVar2 + uVar1;
    if ((uVar2 <= min_new_capacity) && (this->m_capacity < min_new_capacity)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this,min_new_capacity,true,4,(object_mover)0x0,false);
    }
    this->m_size = min_new_capacity;
    memcpy(this->m_p + uVar2,__src,(ulong)uVar1 << 2);
  }
  return this;
}

Assistant:

vector& append(const vector& other)
        {
            if (other.m_size)
            {
                insert(m_size, &other[0], other.m_size);
            }
            return *this;
        }